

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O3

bool operator<(AmsNetId *lhs,AmsNetId *rhs)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar1 = lhs->b[0];
  bVar2 = rhs->b[0];
  bVar4 = true;
  if (bVar1 == bVar2) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 4) {
        return false;
      }
      bVar1 = lhs->b[uVar3 + 2];
      bVar2 = rhs->b[uVar3 + 2];
      uVar3 = uVar3 + 1;
    } while (bVar1 == bVar2);
    bVar4 = uVar3 < 5;
  }
  return (bool)(bVar1 < bVar2 & bVar4);
}

Assistant:

bool operator<(const AmsNetId& lhs, const AmsNetId& rhs)
{
    for (unsigned int i = 0; i < sizeof(rhs.b); ++i) {
        if (lhs.b[i] != rhs.b[i]) {
            return lhs.b[i] < rhs.b[i];
        }
    }
    return false;
}